

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O1

string * __thiscall OB::Parg::help_abi_cxx11_(string *__return_storage_ptr__,Parg *this)

{
  pointer pbVar1;
  string *psVar2;
  Parg *pPVar3;
  ostream *poVar4;
  const_iterator __begin3;
  pointer piVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t;
  pointer pbVar6;
  stringstream local_378 [8];
  stringstream out;
  ostream local_368 [112];
  ios_base local_2f8 [264];
  stringstream local_1f0 [8];
  stringstream ss;
  ostream local_1e0 [112];
  ios_base local_170 [264];
  pointer local_68;
  string *local_60;
  Parg *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  std::__cxx11::stringstream::stringstream(local_378);
  if ((this->description_)._M_string_length != 0) {
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_368,(this->name_)._M_dataplus._M_p,(this->name_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__cxx11::stringstream::stringstream(local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"  ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_368,(this->description_)._M_dataplus._M_p,
                        (this->description_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__cxx11::stringbuf::str();
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(local_368,(char *)local_50,local_48)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1f0);
    std::ios_base::~ios_base(local_170);
  }
  if ((this->usage_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"Usage: ",7);
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"\n",1);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_368,(this->usage_)._M_dataplus._M_p,(this->usage_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
  }
  if ((this->modes_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"Flags: ",7);
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_368,(this->modes_)._M_dataplus._M_p,(this->modes_)._M_string_length);
  }
  if ((this->options_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"\nOptions: ",10);
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_368,(this->options_)._M_dataplus._M_p,(this->options_)._M_string_length);
  }
  piVar5 = (this->info_).
           super__Vector_base<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_68 = (this->info_).
             super__Vector_base<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_60 = __return_storage_ptr__;
  local_58 = this;
  if (piVar5 != local_68) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(local_368,"\n",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_368,(piVar5->title)._M_dataplus._M_p,
                          (piVar5->title)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,":",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      pbVar1 = (piVar5->text).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar6 = (piVar5->text).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar1; pbVar6 = pbVar6 + 1
          ) {
        std::__ostream_insert<char,std::char_traits<char>>(local_368,"  ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_368,(pbVar6->_M_dataplus)._M_p,pbVar6->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      piVar5 = piVar5 + 1;
    } while (piVar5 != local_68);
  }
  pPVar3 = local_58;
  psVar2 = local_60;
  if ((local_58->author_)._M_string_length != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"\nAuthor: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(local_368,"\n",1);
    std::__cxx11::stringstream::stringstream(local_1f0);
    std::__ostream_insert<char,std::char_traits<char>>(local_1e0,"  ",2);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1e0,(pPVar3->author_)._M_dataplus._M_p,
                        (pPVar3->author_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>(local_368,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1f0);
    std::ios_base::~ios_base(local_170);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_378);
  std::ios_base::~ios_base(local_2f8);
  return psVar2;
}

Assistant:

std::string help() const
  {
    std::stringstream out;
    if (! description_.empty())
    {
      out << name_ << ":" << "\n";
      std::stringstream ss;
      out << "  " << description_ << "\n";
      out << ss.str() << "\n";
    }

    if (! usage_.empty())
    {
      out << "Usage: " << "\n"
        << usage_ << "\n";
    }

    if (! modes_.empty())
    {
      out << "Flags: " << "\n"
        << modes_;
    }

    if (! options_.empty())
    {
      out << "\nOptions: " << "\n"
        << options_;
    }

    if (! info_.empty())
    {
      for (auto const& e : info_)
      {
        out << "\n" << e.title << ":" << "\n";

        for (auto const& t : e.text)
        {
          out << "  " << t << "\n";
        }
      }
    }

    if (! author_.empty())
    {
      out << "\nAuthor: " << "\n";
      std::stringstream ss;
      ss << "  " << author_ << "\n";
      out << ss.str();
    }

    return out.str();
  }